

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

Type * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::Type,LLVMBC::LLVMContext&,LLVMBC::Type::TypeID&>
          (LLVMContext *this,LLVMContext *u,TypeID *u_1)

{
  Type *this_00;
  Type *t;
  Type *mem;
  TypeID *u_local_1;
  LLVMContext *u_local;
  LLVMContext *this_local;
  
  this_00 = (Type *)allocate(this,0x10,8);
  if (this_00 == (Type *)0x0) {
    std::terminate();
  }
  Type::Type(this_00,u,*u_1);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}